

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O1

void start_checkpoint(storage_t *st)

{
  __atomic_base<unsigned_long> __s2;
  bool bVar1;
  fdb_file_handle *pfVar2;
  fdb_status fVar3;
  int iVar4;
  checkpoint_t *pcVar5;
  size_t sVar6;
  __atomic_base<unsigned_long> __s;
  fdb_seqnum_t fVar7;
  char *unaff_RBP;
  undefined4 uVar8;
  fdb_doc *pfVar9;
  checkpoint_t *handle_in;
  char *pcVar10;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *pfVar12;
  fdb_file_handle *fhandle;
  char *unaff_R12;
  snap_handle **unaff_R13;
  long lVar13;
  fdb_file_handle **ppfVar14;
  list *doc;
  fdb_doc *chk_doc;
  timeval __test_begin;
  fdb_snapshot_info_t *pfStackY_398;
  uint64_t uStackY_390;
  fdb_kvs_handle **ppfStackY_388;
  fdb_kvs_handle *pfStackY_380;
  list *plStackY_378;
  fdb_file_handle **ppfStackY_368;
  fdb_file_handle *pfStackY_360;
  undefined8 uStackY_358;
  fdb_file_handle **ppfStackY_350;
  timeval tStackY_348;
  checkpoint_t *pcStackY_338;
  char *pcStackY_330;
  snap_handle **ppsStackY_328;
  fdb_kvs_handle *pfStackY_320;
  list *plStackY_318;
  code *pcStackY_310;
  fdb_doc *pfStack_300;
  fdb_iterator *pfStack_2f8;
  fdb_kvs_handle *pfStack_2f0;
  idx_prams_t iStack_2e8;
  timeval tStack_2d0;
  fdb_kvs_handle *pfStack_2c0;
  char *pcStack_2b8;
  checkpoint_t *pcStack_2b0;
  list *plStack_2a8;
  fdb_doc *pfStack_298;
  timeval tStack_290;
  undefined1 auStack_280 [48];
  char acStack_250 [264];
  fdb_kvs_handle *pfStack_148;
  checkpoint_t *pcStack_140;
  undefined1 auStack_130 [24];
  atomic<unsigned_long> aStack_118;
  fdb_kvs_handle *pfStack_110;
  atomic<unsigned_long> aStack_108;
  snap_handle *psStack_f0;
  void *pvStack_e8;
  fdb_iterator *pfStack_e0;
  char acStack_d4 [4];
  fdb_kvs_handle *pfStack_d0;
  fdb_kvs_handle *pfStack_c8;
  fdb_kvs_handle *pfStack_c0;
  char *pcStack_b8;
  size_t sStack_b0;
  timeval tStack_a8;
  fdb_kvs_info fStack_98;
  storage_t *psStack_68;
  fdb_doc *local_30;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_30 = (fdb_doc *)0x0;
  pfVar11 = (fdb_kvs_handle *)st->records;
  uVar8._0_1_ = '\x02';
  uVar8._1_1_ = '\0';
  uVar8._2_1_ = '\0';
  uVar8._3_1_ = '\0';
  fVar3 = fdb_begin_transaction((fdb_file_handle *)pfVar11,'\x02');
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcVar5 = create_checkpoint(st,5);
    sVar6 = strlen(pcVar5->key);
    fdb_doc_create(&local_30,pcVar5,sVar6,(void *)0x0,0,pcVar5,0x430);
    save_tx(st,local_30->key,local_30->keylen,5);
    pfVar11 = st->chk;
    pfVar9 = local_30;
    fVar3 = fdb_set(pfVar11,local_30);
    uVar8 = SUB84(pfVar9,0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      free(pcVar5);
      fdb_doc_free(local_30);
      return;
    }
  }
  else {
    start_checkpoint_cold_1();
  }
  start_checkpoint_cold_2();
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x10995b;
  acStack_d4 = (char  [4])uVar8;
  psStack_68 = st;
  gettimeofday(&tStack_a8,(__timezone_ptr_t)0x0);
  psStack_f0 = (snap_handle *)0x0;
  __s2._M_i = (__int_type)(pfVar11->field_6).seqtree;
  pvStack_e8 = (void *)0x0;
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109973;
  __s._M_i = (__int_type)malloc(0x430);
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109985;
  memset((void *)__s._M_i,0,0x430);
  pfVar12 = (fdb_kvs_handle *)pfVar11->trie;
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109993;
  fVar3 = fdb_get_kvs_info(pfVar12,&fStack_98);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_b8 = (char *)(__s2._M_i + 0xc);
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099b1;
    e2e_fdb_commit(*(fdb_file_handle **)&pfVar11->kvs_config,*(bool *)((long)&pfVar11->file + 6));
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099c0;
    fVar7 = last_snap_seqnum((storage_t *)pfVar11,"e2ekv_alldocs");
    *(fdb_seqnum_t *)(__s._M_i + 0x410) = fVar7;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099d6;
    fVar7 = last_snap_seqnum((storage_t *)pfVar11,"e2ekv_index1");
    *(fdb_seqnum_t *)(__s._M_i + 0x418) = fVar7;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099ec;
    fVar7 = last_snap_seqnum((storage_t *)pfVar11,"e2ekv_index2");
    *(fdb_seqnum_t *)(__s._M_i + 0x420) = fVar7;
    lVar13 = 0;
    unaff_RBP = (char *)0x8421084210842109;
    unaff_R12 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";
    do {
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a0c;
      iVar4 = rand();
      *(char *)(__s._M_i + lVar13) =
           "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
           [(ulong)(long)iVar4 % 0x3e];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0xc);
    *(undefined1 *)(__s._M_i + 0xb) = 0;
    *(undefined4 *)(__s._M_i + 0x400) = (undefined4)fStack_98.doc_count;
    *(undefined2 *)(__s._M_i + 0x40c) = 0;
    *(short *)(__s._M_i + 0x428) = acStack_d4._0_2_;
    pfVar12 = (fdb_kvs_handle *)(pfVar11->kvs_config).custom_cmp;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a74;
    fVar3 = fdb_snapshot_open(pfVar12,&pfStack_d0,*(fdb_seqnum_t *)(__s._M_i + 0x410));
    unaff_R13 = (snap_handle **)0xc;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00109c41;
    pfVar12 = (fdb_kvs_handle *)(pfVar11->kvs_config).custom_cmp_param;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a91;
    fVar3 = fdb_snapshot_open(pfVar12,&pfStack_c0,*(fdb_seqnum_t *)(__s._M_i + 0x418));
    unaff_R12 = pcStack_b8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00109c46;
    pfVar12 = (fdb_kvs_handle *)pfVar11->kvs;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ab3;
    fVar3 = fdb_snapshot_open(pfVar12,&pfStack_c8,*(fdb_seqnum_t *)(__s._M_i + 0x420));
    if (fVar3 == FDB_RESULT_SUCCESS) {
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ae2;
      fVar3 = fdb_iterator_init(pfStack_c0,&pfStack_e0,(void *)__s2._M_i,0xc,unaff_R12,0xc,2);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfVar11 = (fdb_kvs_handle *)&pfVar11->file;
        unaff_R13 = &psStack_f0;
        do {
          aStack_108.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109b4c;
          fVar3 = fdb_iterator_get(pfStack_e0,(fdb_doc **)unaff_R13);
          if (fVar3 == FDB_RESULT_SUCCESS) {
            unaff_RBP = (char *)psStack_f0->snap_tag_idx;
            aStack_108.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109b68;
            iVar4 = strcmp(unaff_RBP,(char *)__s2._M_i);
            if (iVar4 < 0) {
LAB_00109c29:
              aStack_108.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109c37;
              create_checkpoint_cold_5();
            }
            else {
              aStack_108.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109b7b;
              iVar4 = strcmp(unaff_RBP,unaff_R12);
              if (0 < iVar4) goto LAB_00109c29;
            }
            aStack_108.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109ba4;
            fVar3 = fdb_get_kv(pfStack_d0,(void *)psStack_f0->seqnum,
                               (size_t)(psStack_f0->avl_id).right,&pvStack_e8,&sStack_b0);
            if (fVar3 == FDB_RESULT_SUCCESS) {
              aStack_108.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109bbd;
              iVar4 = strcmp((char *)((long)pvStack_e8 + 0xe00),(char *)pfVar11);
              if (iVar4 == 0) {
                *(int *)(__s._M_i + 0x404) = *(int *)(__s._M_i + 0x404) + 1;
                aStack_108.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)0x109bd6;
                pfVar12 = pfStack_c8;
                fVar3 = fdb_get(pfStack_c8,(fdb_doc *)psStack_f0);
                if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00109c50;
                *(int *)(__s._M_i + 0x408) = *(int *)(__s._M_i + 0x408) + *(int *)psStack_f0->seqnum
                ;
              }
              aStack_108.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109bf5;
              free(pvStack_e8);
              pvStack_e8 = (void *)0x0;
            }
            aStack_108.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109c08;
            fdb_doc_free((fdb_doc *)psStack_f0);
            psStack_f0 = (snap_handle *)0x0;
          }
          aStack_108.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109c1b;
          fVar3 = fdb_iterator_next(pfStack_e0);
        } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      }
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109af0;
      fdb_doc_free((fdb_doc *)psStack_f0);
      psStack_f0 = (snap_handle *)0x0;
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b03;
      fdb_iterator_close(pfStack_e0);
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b0d;
      fdb_kvs_close(pfStack_d0);
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b17;
      fdb_kvs_close(pfStack_c0);
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b21;
      fdb_kvs_close(pfStack_c8);
      return;
    }
  }
  else {
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c41;
    create_checkpoint_cold_1();
LAB_00109c41:
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c46;
    create_checkpoint_cold_2();
LAB_00109c46:
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c4b;
    create_checkpoint_cold_3();
  }
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c50;
  create_checkpoint_cold_4();
LAB_00109c50:
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)end_checkpoint;
  create_checkpoint_cold_6();
  pcStack_140 = (checkpoint_t *)0x109c6d;
  aStack_118.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__s._M_i;
  pfStack_110 = pfVar11;
  aStack_108.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__s2._M_i;
  gettimeofday((timeval *)(auStack_130 + 8),(__timezone_ptr_t)0x0);
  doc = (list *)auStack_130;
  auStack_130._0_8_ = (fdb_doc *)0x0;
  pcStack_140 = (checkpoint_t *)0x109c86;
  pcVar5 = create_checkpoint((storage_t *)pfVar12,6);
  pcStack_140 = (checkpoint_t *)0x109c91;
  sVar6 = strlen(pcVar5->key);
  pcStack_140 = (checkpoint_t *)0x109caf;
  fdb_doc_create((fdb_doc **)doc,pcVar5,sVar6,(void *)0x0,0,pcVar5,0x430);
  pcStack_140 = (checkpoint_t *)0x109cc6;
  save_tx((storage_t *)pfVar12,*(void **)(auStack_130._0_8_ + 0x20),*(size_t *)auStack_130._0_8_,6);
  pfVar11 = (fdb_kvs_handle *)pfVar12->op_stats;
  pcStack_140 = (checkpoint_t *)0x109cd3;
  fVar3 = fdb_end_transaction((fdb_file_handle *)pfVar11,
                              *(fdb_commit_opt_t *)((long)&pfVar12->file + 6));
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar11 = (fdb_kvs_handle *)pfVar12->trie;
    pcStack_140 = (checkpoint_t *)0x109ce5;
    fVar3 = fdb_set(pfVar11,(fdb_doc *)auStack_130._0_8_);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pcStack_140 = (checkpoint_t *)0x109cf1;
      free(pcVar5);
      pcStack_140 = (checkpoint_t *)0x109cfb;
      fdb_doc_free((fdb_doc *)auStack_130._0_8_);
      return;
    }
  }
  else {
    pcStack_140 = (checkpoint_t *)0x109d0a;
    end_checkpoint_cold_1();
  }
  pcStack_140 = (checkpoint_t *)e2e_fdb_cancel_checkpoint;
  end_checkpoint_cold_2();
  plStack_2a8 = (list *)0x109d28;
  pfStack_148 = pfVar12;
  pcStack_140 = pcVar5;
  gettimeofday(&tStack_290,(__timezone_ptr_t)0x0);
  pfStack_298 = (fdb_doc *)0x0;
  pfVar12 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)&pfVar11->trie)->super___atomic_base<unsigned_long>)._M_i;
  handle_in = (checkpoint_t *)auStack_280;
  plStack_2a8 = (list *)0x109d3f;
  fVar3 = fdb_get_kvs_info(pfVar12,(fdb_kvs_info *)handle_in);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar12 = (fdb_kvs_handle *)&pfStack_298;
    handle_in = (checkpoint_t *)0x0;
    plStack_2a8 = (list *)0x109d65;
    fVar3 = fdb_doc_create((fdb_doc **)pfVar12,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00109e64;
    pfStack_298->seqnum = auStack_280._8_8_;
    plStack_2a8 = (list *)0x109d84;
    fdb_get_byseq((fdb_kvs_handle *)
                  (((atomic<unsigned_long> *)&pfVar11->trie)->super___atomic_base<unsigned_long>).
                  _M_i,pfStack_298);
    pcVar5 = (checkpoint_t *)pfStack_298->body;
    if (pcVar5->type != 5) {
      plStack_2a8 = (list *)0x109da4;
      e2e_fdb_cancel_checkpoint_cold_3();
    }
    pfVar12 = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp;
    handle_in = (checkpoint_t *)pcVar5->seqnum_all;
    plStack_2a8 = (list *)0x109db4;
    fVar3 = fdb_rollback((fdb_kvs_handle **)pfVar12,(fdb_seqnum_t)handle_in);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00109e69;
    pfVar12 = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp_param;
    handle_in = (checkpoint_t *)pcVar5->seqnum_idx1;
    plStack_2a8 = (list *)0x109dcc;
    fVar3 = fdb_rollback((fdb_kvs_handle **)pfVar12,(fdb_seqnum_t)handle_in);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00109e6e;
    pfVar12 = (fdb_kvs_handle *)&pfVar11->kvs;
    handle_in = (checkpoint_t *)pcVar5->seqnum_idx2;
    plStack_2a8 = (list *)0x109de4;
    fVar3 = fdb_rollback((fdb_kvs_handle **)pfVar12,(fdb_seqnum_t)handle_in);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00109e73;
    plStack_2a8 = (list *)0x109dfd;
    handle_in = pcVar5;
    memcpy(pfVar11->staletree,pcVar5,0x430);
    pfVar12 = (fdb_kvs_handle *)
              (((atomic<unsigned_long> *)&pfVar11->op_stats)->super___atomic_base<unsigned_long>).
              _M_i;
    plStack_2a8 = (list *)0x109e06;
    fVar3 = fdb_abort_transaction((fdb_file_handle *)pfVar12);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      plStack_2a8 = (list *)0x109e27;
      sprintf(auStack_280 + 0x30,"revert to checkpoint[seqno:%lu]\n",pcVar5->seqnum_all);
      pcVar10 = "%s PASSED\n";
      if (e2e_fdb_cancel_checkpoint::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      plStack_2a8 = (list *)0x109e54;
      fprintf(_stderr,pcVar10,auStack_280 + 0x30);
      return;
    }
  }
  else {
    plStack_2a8 = (list *)0x109e64;
    e2e_fdb_cancel_checkpoint_cold_1();
LAB_00109e64:
    plStack_2a8 = (list *)0x109e69;
    e2e_fdb_cancel_checkpoint_cold_2();
LAB_00109e69:
    plStack_2a8 = (list *)0x109e6e;
    e2e_fdb_cancel_checkpoint_cold_4();
LAB_00109e6e:
    plStack_2a8 = (list *)0x109e73;
    e2e_fdb_cancel_checkpoint_cold_5();
LAB_00109e73:
    plStack_2a8 = (list *)0x109e78;
    e2e_fdb_cancel_checkpoint_cold_6();
  }
  plStack_2a8 = (list *)scan;
  e2e_fdb_cancel_checkpoint_cold_7();
  pcStackY_310 = (code *)0x109e9a;
  pfStack_2c0 = pfVar11;
  pcStack_2b8 = unaff_R12;
  pcStack_2b0 = pcVar5;
  plStack_2a8 = doc;
  gettimeofday(&tStack_2d0,(__timezone_ptr_t)0x0);
  pfStack_300 = (fdb_doc *)0x0;
  pcStackY_310 = (code *)0x109ead;
  gen_index_params(&iStack_2e8);
  if (handle_in != (checkpoint_t *)0x0) {
    pcStackY_310 = (code *)0x109ec6;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)handle_in,&pfStack_2f0,0xffffffffffffffff);
    if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00109eec;
    pcStackY_310 = (code *)0x109ecf;
    scan_cold_1();
  }
  pfVar11 = (fdb_kvs_handle *)(pfVar12->kvs_config).custom_cmp_param;
  ptr_handle = &pfStack_2f0;
  pcStackY_310 = (code *)0x109ee4;
  fVar3 = fdb_snapshot_open(pfVar11,ptr_handle,0xffffffffffffffff);
  if (fVar3 == FDB_RESULT_SUCCESS) {
LAB_00109eec:
    pcStackY_310 = (code *)0x109f1a;
    fVar3 = fdb_iterator_init(pfStack_2f0,&pfStack_2f8,&iStack_2e8,0xc,iStack_2e8.max,0xc,0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      do {
        pcStackY_310 = (code *)0x109f50;
        fVar3 = fdb_iterator_get(pfStack_2f8,&pfStack_300);
        if (fVar3 == FDB_RESULT_SUCCESS) {
          pcVar10 = (char *)pfStack_300->key;
          pcStackY_310 = (code *)0x109f68;
          iVar4 = strcmp(pcVar10,iStack_2e8.min);
          if (iVar4 < 0) {
LAB_00109fa2:
            pcStackY_310 = (code *)0x109fb0;
            scan_cold_3();
          }
          else {
            pcStackY_310 = (code *)0x109f77;
            iVar4 = strcmp(pcVar10,iStack_2e8.max);
            if (0 < iVar4) goto LAB_00109fa2;
          }
          pcStackY_310 = (code *)0x109f85;
          fdb_doc_free(pfStack_300);
          pfStack_300 = (fdb_doc *)0x0;
        }
        pcStackY_310 = (code *)0x109f98;
        fVar3 = fdb_iterator_next(pfStack_2f8);
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    }
    pcStackY_310 = (code *)0x109f28;
    fdb_iterator_close(pfStack_2f8);
    return;
  }
  pcStackY_310 = last_snap_seqnum;
  scan_cold_2();
  plStackY_378 = (list *)0x109fd7;
  pcStackY_338 = handle_in;
  pcStackY_330 = unaff_R12;
  ppsStackY_328 = unaff_R13;
  pfStackY_320 = pfVar12;
  plStackY_318 = doc;
  pcStackY_310 = (code *)unaff_RBP;
  gettimeofday(&tStackY_348,(__timezone_ptr_t)0x0);
  fhandle = *(fdb_file_handle **)&pfVar11->kvs_config;
  ppfVar14 = &pfStackY_360;
  plStackY_378 = (list *)0x109fe9;
  fVar3 = fdb_get_all_snap_markers
                    (fhandle,(fdb_snapshot_info_t **)ppfVar14,(uint64_t *)&ppfStackY_350);
  pfVar2 = pfStackY_360;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStackY_368 = ppfStackY_350;
    if (ppfStackY_350 == (fdb_file_handle **)0x0) {
      bVar1 = false;
    }
    else {
      ppfVar14 = (fdb_file_handle **)0x0;
      bVar1 = false;
      do {
        doc = (&pfVar2->handles)[(long)ppfVar14 * 3];
        if (0 < (long)doc) {
          pfVar11 = (fdb_kvs_handle *)&(&pfVar2->cmp_func_list)[(long)ppfVar14 * 3]->tail;
          do {
            plStackY_378 = (list *)0x10a037;
            iVar4 = strcmp((char *)pfVar11[-1].bub_ctx.handle,(char *)ptr_handle);
            if (iVar4 == 0) {
              uStackY_358 = *(undefined8 *)&pfVar11->kvs_config;
              bVar1 = true;
              break;
            }
            pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp_param;
            doc = (list *)((long)&doc[-1].tail + 7);
          } while (doc != (list *)0x0);
        }
      } while ((!bVar1) &&
              (ppfVar14 = (fdb_file_handle **)((long)ppfVar14 + 1), ppfVar14 != ppfStackY_368));
    }
    plStackY_378 = (list *)0x10a074;
    ppfVar14 = ppfStackY_368;
    fVar3 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStackY_360,(uint64_t)ppfStackY_368);
    fhandle = pfStackY_360;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      if (bVar1) {
        return;
      }
      goto LAB_0010a09c;
    }
  }
  else {
    plStackY_378 = (list *)0x10a097;
    last_snap_seqnum();
  }
  plStackY_378 = (list *)0x10a09c;
  last_snap_seqnum();
LAB_0010a09c:
  plStackY_378 = (list *)print_n_markers;
  last_snap_seqnum();
  ppfStackY_388 = ptr_handle;
  pfStackY_380 = pfVar11;
  plStackY_378 = doc;
  fdb_get_all_snap_markers((fdb_file_handle *)fhandle->root,&pfStackY_398,&uStackY_390);
  if (ppfVar14 != (fdb_file_handle **)0x0) {
    lVar13 = 0x10;
    do {
      printf("marker:  %lu\n",*(undefined8 *)(*(long *)((long)&pfStackY_398->marker + lVar13) + 8));
      lVar13 = lVar13 + 0x18;
      ppfVar14 = (fdb_file_handle **)((long)ppfVar14 + -1);
    } while (ppfVar14 != (fdb_file_handle **)0x0);
  }
  return;
}

Assistant:

void start_checkpoint(storage_t *st)
{
    TEST_INIT();

    checkpoint_t *chk;
    fdb_status status;
    fdb_doc *chk_doc = NULL;

    status = fdb_begin_transaction(st->records, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create opening checkpoint doc
    chk = create_checkpoint(st, START_CHECKPOINT);
    fdb_doc_create(&chk_doc, chk->key, strlen(chk->key),
                   NULL, 0, chk, sizeof(checkpoint_t));

    // save checkpoint transaction
    save_tx(st, chk_doc->key, chk_doc->keylen, START_CHECKPOINT);
    status = fdb_set(st->chk, chk_doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);


#ifdef __DEBUG_E2E
    char rbuf[256];
    sprintf(rbuf, "start checkpoint[seqno:%" _F64 "]",chk->seqnum_all);
    TEST_RESULT(rbuf);
#endif

    free(chk);
    fdb_doc_free(chk_doc);
    chk_doc=NULL;
    chk=NULL;


}